

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  char **in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int height;
  Node *x;
  memory_order __b;
  Node *prev [12];
  __memory_order_modifier in_stack_ffffffffffffff28;
  memory_order in_stack_ffffffffffffff2c;
  char **in_stack_ffffffffffffff30;
  int n;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar6;
  int iVar7;
  int local_a0;
  undefined8 local_68 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar4 = FindGreaterOrEqual((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RDI,
                              (Node **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                             );
  bVar5 = 1;
  if (pNVar4 != (Node *)0x0) {
    bVar1 = Equal((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                  in_stack_ffffffffffffff30,
                  (char **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar5 = bVar1 ^ 0xff;
  }
  if ((bVar5 & 1) == 0) {
    __assert_fail("x == nullptr || !Equal(key, x->key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0x158,
                  "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  iVar2 = RandomHeight((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar6 = iVar2;
  iVar3 = GetMaxHeight(in_stack_ffffffffffffff40);
  if (iVar3 < iVar6) {
    for (local_a0 = GetMaxHeight(in_stack_ffffffffffffff40); local_a0 < iVar2;
        local_a0 = local_a0 + 1) {
      local_68[local_a0] = in_RDI[3];
    }
    in_stack_ffffffffffffff40 =
         (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)(in_RDI + 4);
    std::operator&(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff48 = 0;
    *(int *)&(in_stack_ffffffffffffff40->compare_).comparator.super_Comparator._vptr_Comparator =
         iVar2;
  }
  pNVar4 = NewNode((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                   CONCAT44(iVar6,in_stack_ffffffffffffff48),(char **)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff3c);
  iVar3 = (int)((ulong)pNVar4 >> 0x20);
  iVar6 = 0;
  while (iVar6 < iVar2) {
    iVar7 = iVar6;
    n = iVar3;
    Node::NoBarrier_Next((Node *)CONCAT44(iVar6,in_stack_ffffffffffffff38),iVar3);
    Node::NoBarrier_SetNext
              ((Node *)CONCAT44(iVar6,in_stack_ffffffffffffff38),n,
               (Node *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    Node::SetNext((Node *)CONCAT44(iVar6,in_stack_ffffffffffffff38),n,
                  (Node *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar6 = iVar7 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}